

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadsavemenu.cpp
# Opt level: O0

bool __thiscall DLoadSaveMenu::MenuEvent(DLoadSaveMenu *this,int mkey,bool fromcontroller)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  FSaveGameNode **ppFVar5;
  char *__filename;
  int local_4c;
  int listindex;
  bool fromcontroller_local;
  int mkey_local;
  DLoadSaveMenu *this_local;
  
  switch(mkey) {
  case 0:
    uVar2 = TArray<FSaveGameNode_*,_FSaveGameNode_*>::Size(&SaveGames);
    if (1 < uVar2) {
      if (this->Selected == -1) {
        this->Selected = this->TopItem;
      }
      else {
        iVar4 = this->Selected + -1;
        this->Selected = iVar4;
        if (iVar4 < 0) {
          uVar2 = TArray<FSaveGameNode_*,_FSaveGameNode_*>::Size(&SaveGames);
          this->Selected = uVar2 - 1;
        }
        if (this->Selected < this->TopItem) {
          this->TopItem = this->Selected;
        }
        else if (this->TopItem + this->listboxRows <= this->Selected) {
          iVar4 = MAX<int>(0,(this->Selected - this->listboxRows) + 1);
          this->TopItem = iVar4;
        }
      }
      UnloadSaveData(this);
      ExtractSaveData(this,this->Selected);
    }
    this_local._7_1_ = true;
    break;
  case 1:
    uVar2 = TArray<FSaveGameNode_*,_FSaveGameNode_*>::Size(&SaveGames);
    if (1 < uVar2) {
      if (this->Selected == -1) {
        this->Selected = this->TopItem;
      }
      else {
        uVar3 = this->Selected + 1;
        this->Selected = uVar3;
        uVar2 = TArray<FSaveGameNode_*,_FSaveGameNode_*>::Size(&SaveGames);
        if (uVar2 <= uVar3) {
          this->Selected = 0;
        }
        if (this->Selected < this->TopItem) {
          this->TopItem = this->Selected;
        }
        else if (this->TopItem + this->listboxRows <= this->Selected) {
          iVar4 = MAX<int>(0,(this->Selected - this->listboxRows) + 1);
          this->TopItem = iVar4;
        }
      }
      UnloadSaveData(this);
      ExtractSaveData(this,this->Selected);
    }
    this_local._7_1_ = true;
    break;
  default:
    this_local._7_1_ = DListMenu::MenuEvent(&this->super_DListMenu,mkey,fromcontroller);
    break;
  case 4:
    uVar2 = TArray<FSaveGameNode_*,_FSaveGameNode_*>::Size(&SaveGames);
    if (1 < uVar2) {
      if (this->TopItem == 0) {
        uVar2 = TArray<FSaveGameNode_*,_FSaveGameNode_*>::Size(&SaveGames);
        this->TopItem = uVar2 - this->listboxRows;
        if (this->Selected != -1) {
          this->Selected = this->TopItem;
        }
      }
      else {
        iVar4 = MAX<int>(this->TopItem - this->listboxRows,0);
        this->TopItem = iVar4;
        if (this->TopItem + this->listboxRows <= this->Selected) {
          this->Selected = this->TopItem;
        }
      }
      UnloadSaveData(this);
      ExtractSaveData(this,this->Selected);
    }
    this_local._7_1_ = true;
    break;
  case 5:
    uVar2 = TArray<FSaveGameNode_*,_FSaveGameNode_*>::Size(&SaveGames);
    if (1 < uVar2) {
      iVar4 = this->TopItem;
      uVar2 = TArray<FSaveGameNode_*,_FSaveGameNode_*>::Size(&SaveGames);
      if (iVar4 < (int)(uVar2 - this->listboxRows)) {
        iVar4 = this->TopItem;
        iVar1 = this->listboxRows;
        uVar2 = TArray<FSaveGameNode_*,_FSaveGameNode_*>::Size(&SaveGames);
        iVar4 = MIN<int>(iVar4 + iVar1,uVar2 - this->listboxRows);
        this->TopItem = iVar4;
        if ((this->Selected < this->TopItem) && (this->Selected != -1)) {
          this->Selected = this->TopItem;
        }
      }
      else {
        this->TopItem = 0;
        if (this->Selected != -1) {
          this->Selected = 0;
        }
      }
      UnloadSaveData(this);
      ExtractSaveData(this,this->Selected);
    }
    this_local._7_1_ = true;
    break;
  case 6:
    this_local._7_1_ = false;
    break;
  case 0xc:
    uVar2 = this->Selected;
    uVar3 = TArray<FSaveGameNode_*,_FSaveGameNode_*>::Size(&SaveGames);
    if (uVar2 < uVar3) {
      ppFVar5 = TArray<FSaveGameNode_*,_FSaveGameNode_*>::operator[](&SaveGames,0);
      if (((*ppFVar5)->bNoDelete & 1U) == 0) {
        local_4c = this->Selected;
      }
      else {
        local_4c = this->Selected + -1;
      }
      ppFVar5 = TArray<FSaveGameNode_*,_FSaveGameNode_*>::operator[]
                          (&SaveGames,(long)this->Selected);
      __filename = FString::GetChars(&(*ppFVar5)->Filename);
      remove(__filename);
      UnloadSaveData(this);
      iVar4 = RemoveSaveSlot(this,this->Selected);
      this->Selected = iVar4;
      ExtractSaveData(this,this->Selected);
      if (LastSaved == local_4c) {
        LastSaved = -1;
      }
      else if (local_4c < LastSaved) {
        LastSaved = LastSaved + -1;
      }
      if (LastAccessed == local_4c) {
        LastAccessed = -1;
      }
      else if (local_4c < LastAccessed) {
        LastAccessed = LastAccessed + -1;
      }
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool DLoadSaveMenu::MenuEvent (int mkey, bool fromcontroller)
{
	switch (mkey)
	{
	case MKEY_Up:
		if (SaveGames.Size() > 1)
		{
			if (Selected == -1) Selected = TopItem;
			else
			{
				if (--Selected < 0) Selected = SaveGames.Size()-1;
				if (Selected < TopItem) TopItem = Selected;
				else if (Selected >= TopItem + listboxRows) TopItem = MAX(0, Selected - listboxRows + 1);
			}
			UnloadSaveData ();
			ExtractSaveData (Selected);
		}
		return true;

	case MKEY_Down:
		if (SaveGames.Size() > 1)
		{
			if (Selected == -1) Selected = TopItem;
			else
			{
				if (unsigned(++Selected) >= SaveGames.Size()) Selected = 0;
				if (Selected < TopItem) TopItem = Selected;
				else if (Selected >= TopItem + listboxRows) TopItem = MAX(0, Selected - listboxRows + 1);
			}
			UnloadSaveData ();
			ExtractSaveData (Selected);
		}
		return true;

	case MKEY_PageDown:
		if (SaveGames.Size() > 1)
		{
			if (TopItem >= (int)SaveGames.Size() - listboxRows)
			{
				TopItem = 0;
				if (Selected != -1) Selected = 0;
			}
			else
			{
				TopItem = MIN<int>(TopItem + listboxRows, SaveGames.Size() - listboxRows);
				if (TopItem > Selected && Selected != -1) Selected = TopItem;
			}
			UnloadSaveData ();
			ExtractSaveData (Selected);
		}
		return true;

	case MKEY_PageUp:
		if (SaveGames.Size() > 1)
		{
			if (TopItem == 0)
			{
				TopItem = SaveGames.Size() - listboxRows;
				if (Selected != -1) Selected = TopItem;
			}
			else
			{
				TopItem = MAX(TopItem - listboxRows, 0);
				if (Selected >= TopItem + listboxRows) Selected = TopItem;
			}
			UnloadSaveData ();
			ExtractSaveData (Selected);
		}
		return true;

	case MKEY_Enter:
		return false;	// This event will be handled by the subclasses

	case MKEY_MBYes:
	{
		if ((unsigned)Selected < SaveGames.Size())
		{
			int listindex = SaveGames[0]->bNoDelete? Selected-1 : Selected;
			remove (SaveGames[Selected]->Filename.GetChars());
			UnloadSaveData ();
			Selected = RemoveSaveSlot (Selected);
			ExtractSaveData (Selected);

			if (LastSaved == listindex) LastSaved = -1;
			else if (LastSaved > listindex) LastSaved--;
			if (LastAccessed == listindex) LastAccessed = -1;
			else if (LastAccessed > listindex) LastAccessed--;
		}
		return true;
	}

	default:
		return Super::MenuEvent(mkey, fromcontroller);
	}
}